

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImFontAtlas::GlyphRangesBuilder::SetBit(GlyphRangesBuilder *this,int n)

{
  byte *pbVar1;
  int n_local;
  GlyphRangesBuilder *this_local;
  
  pbVar1 = ImVector<unsigned_char>::operator[]((ImVector<unsigned_char> *)this,n >> 3);
  *pbVar1 = *pbVar1 | (byte)(1 << ((byte)n & 7));
  return;
}

Assistant:

void           SetBit(int n)        { UsedChars[n >> 3] |= 1 << (n & 7); }